

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pt.cpp
# Opt level: O0

long testStringToInteger(int count)

{
  long lVar1;
  long lVar2;
  int local_54;
  int i;
  long start;
  allocator<char> local_31;
  undefined1 local_30 [8];
  string value;
  int count_local;
  
  value.field_2._12_4_ = count;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)local_30,"1234",&local_31);
  std::allocator<char>::~allocator(&local_31);
  value.field_2._12_4_ = value.field_2._12_4_ + -1;
  lVar1 = GetTickCount();
  for (local_54 = 0; local_54 <= (int)value.field_2._12_4_; local_54 = local_54 + 1) {
    FIX::IntConvertor::convert((string *)local_30);
  }
  lVar2 = GetTickCount();
  std::__cxx11::string::~string((string *)local_30);
  return lVar2 - lVar1;
}

Assistant:

long testStringToInteger( int count )
{
  std::string value( "1234" );
  count = count - 1;

  long start = GetTickCount();
  for ( int i = 0; i <= count; ++i )
  {
    FIX::IntConvertor::convert( value );
  }
  return GetTickCount() - start;
}